

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Open(PersistentStorageJson *this)

{
  Status SVar1;
  ulong uVar2;
  undefined1 local_20 [24];
  PersistentStorageJson *this_local;
  
  local_20._16_8_ = this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    JsonDefault_abi_cxx11_((PersistentStorageJson *)local_20);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(&this->mCache,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_20);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_20);
  }
  CacheFromFile(this);
  SVar1 = CacheToFile(this);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Open()
{
    if (mFileName.empty())
    {
        // No persistence, use default contents
        mCache = JsonDefault();
    }
    CacheFromFile();
    return CacheToFile();
}